

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

vector_s<unsigned_int,_10UL> * __thiscall
estl::vector_s<unsigned_int,10ul>::operator=
          (vector_s<unsigned_int,10ul> *this,vector_s<unsigned_int,_9UL> *other)

{
  long lVar1;
  const_reference pvVar2;
  size_type sVar3;
  pointer insert_ptr;
  size_type i;
  vector_s<unsigned_int,_9UL> *other_local;
  vector_s<unsigned_int,_10UL> *this_local;
  
  if ((vector_s<unsigned_int,_9UL> *)this != other) {
    insert_ptr = (pointer)vector_s<unsigned_int,_9UL>::size(other);
    while (insert_ptr != (pointer)0x0) {
      insert_ptr = (pointer)((long)insert_ptr - 1);
      lVar1 = *(long *)(this + 0x30);
      pvVar2 = vector_s<unsigned_int,_9UL>::operator[](other,(size_type)insert_ptr);
      *(value_type_conflict *)(lVar1 + (long)insert_ptr * 4) = *pvVar2;
    }
    sVar3 = vector_s<unsigned_int,_9UL>::size(other);
    *(size_type *)this = sVar3;
  }
  return (vector_s<unsigned_int,_10UL> *)this;
}

Assistant:

vector_s& operator=(const vector_s<T, CAPACITY_OTHER>& other)
    {
        // NOTE: The reinterpret cast is needed as the pointer types can potentially
        //       be different if the capacities of the vectors are different.
        //       As we merely need to check the pointer adresses it's ok with
        //       with this "crude" cast here!
        if (reinterpret_cast<void*>(this) != reinterpret_cast<const void*>(&other)) // prevent self-assignment
        {
            for (size_type i = other.size(); i > 0; ) {
                --i;
                const pointer insert_ptr = data_ptr_ + i;
                new (insert_ptr) value_type(other[i]);
            }
            size_ = other.size();
        }
        return *this;
    }